

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O2

void __thiscall
pele::physics::pltfilemanager::PltFileManager::readGenericPlotfileHeader
          (PltFileManager *this,string *a_pltFileHeader)

{
  int *piVar1;
  double dVar2;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *pVVar3;
  int iVar4;
  istream *piVar5;
  int lev_1;
  long lVar6;
  double *pdVar7;
  Vector<int,_std::allocator<int>_> *this_00;
  size_type __new_size;
  int n;
  long lVar8;
  int coord_sys;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *local_460;
  string line;
  int PLT_SPACEDIM;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> Domains;
  string word;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  Real prob_hi [3];
  Real prob_lo [3];
  string fileCharPtrString;
  RealBox local_378;
  Array<int,_3> perio;
  istringstream is;
  istringstream lis;
  
  fileCharPtr.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  fileCharPtr.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  fileCharPtr.super_vector<char,_std::allocator<char>_>.
  super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  _is = amrex::ParallelDescriptor::m_comm;
  amrex::ParallelDescriptor::ReadAndBcastFile(a_pltFileHeader,&fileCharPtr,true,(MPI_Comm *)&is);
  std::__cxx11::string::string
            ((string *)&fileCharPtrString,
             fileCharPtr.super_vector<char,_std::allocator<char>_>.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start,(allocator *)&is);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&is,(string *)&fileCharPtrString,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&line);
  this->m_nvars = 0;
  std::istream::operator>>((istream *)&is,&this->m_nvars);
  GotoNextLine((istream *)&is);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&(this->m_vars).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,(long)this->m_nvars);
  lVar6 = 0;
  for (lVar8 = 0; lVar8 < this->m_nvars; lVar8 = lVar8 + 1) {
    std::operator>>((istream *)&is,
                    (string *)
                    ((long)&(((this->m_vars).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6)
                   );
    GotoNextLine((istream *)&is);
    lVar6 = lVar6 + 0x20;
  }
  PLT_SPACEDIM = 3;
  std::istream::operator>>((istream *)&is,&PLT_SPACEDIM);
  GotoNextLine((istream *)&is);
  std::istream::_M_extract<double>((double *)&is);
  GotoNextLine((istream *)&is);
  piVar1 = &this->m_nlevels;
  std::istream::operator>>((istream *)&is,piVar1);
  GotoNextLine((istream *)&is);
  __new_size = (long)this->m_nlevels + 1;
  this->m_nlevels = (int)__new_size;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
            (&(this->m_grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
             __new_size);
  local_460 = &this->m_geoms;
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::resize
            (&local_460->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,
             (long)this->m_nlevels);
  this_00 = &this->m_refRatio;
  std::vector<int,_std::allocator<int>_>::resize
            (&this_00->super_vector<int,_std::allocator<int>_>,(long)this->m_nlevels - 1);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&line);
  std::__cxx11::istringstream::istringstream((istringstream *)&lis,(string *)&line,_S_in);
  pdVar7 = prob_lo;
  while( true ) {
    piVar5 = std::operator>>((istream *)&lis,(string *)&word);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    dVar2 = std::__cxx11::stod(&word,(size_t *)0x0);
    *pdVar7 = dVar2;
    pdVar7 = pdVar7 + 1;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&lis);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&line);
  std::__cxx11::istringstream::istringstream((istringstream *)&lis,(string *)&line,_S_in);
  pdVar7 = prob_hi;
  while( true ) {
    piVar5 = std::operator>>((istream *)&lis,(string *)&word);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    dVar2 = std::__cxx11::stod(&word,(size_t *)0x0);
    *pdVar7 = dVar2;
    pdVar7 = pdVar7 + 1;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&lis);
  local_378.xlo[0] = prob_lo[0];
  local_378.xlo[1] = prob_lo[1];
  local_378.xlo[2] = prob_lo[2];
  local_378.xhi[0] = prob_hi[0];
  local_378.xhi[1] = prob_hi[1];
  local_378.xhi[2] = prob_hi[2];
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&line);
  std::__cxx11::istringstream::istringstream((istringstream *)&lis,(string *)&line,_S_in);
  lVar6 = 0;
  while( true ) {
    piVar5 = std::operator>>((istream *)&lis,(string *)&word);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    iVar4 = std::__cxx11::stoi(&word,(size_t *)0x0,10);
    *(int *)((long)(this_00->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + lVar6) = iVar4;
    lVar6 = lVar6 + 4;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&lis);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            (&Domains.super_vector<amrex::Box,_std::allocator<amrex::Box>_>,(long)*piVar1,
             (allocator_type *)&lis);
  lVar6 = 0;
  for (lVar8 = 0; lVar8 < *piVar1; lVar8 = lVar8 + 1) {
    amrex::operator>>((istream *)&is,
                      (Box *)((long)((Domains.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->smallend).vect +
                             lVar6));
    lVar6 = lVar6 + 0x1c;
  }
  GotoNextLine((istream *)&is);
  GotoNextLine((istream *)&is);
  for (iVar4 = 0; iVar4 < *piVar1; iVar4 = iVar4 + 1) {
    GotoNextLine((istream *)&is);
  }
  coord_sys = 0;
  std::istream::operator>>((istream *)&is,&coord_sys);
  GotoNextLine((istream *)&is);
  perio._M_elems[2] = 0;
  perio._M_elems[0] = 0;
  perio._M_elems[1] = 0;
  amrex::Geometry::Geometry
            ((Geometry *)&lis,
             Domains.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start,&local_378,coord_sys,&perio);
  memcpy((local_460->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
         super__Vector_impl_data._M_start,(Geometry *)&lis,200);
  pVVar3 = local_460;
  lVar8 = 0;
  for (lVar6 = 1; lVar6 < *piVar1; lVar6 = lVar6 + 1) {
    amrex::refine((Geometry *)&lis,
                  (Geometry *)
                  ((long)(((pVVar3->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>)
                           .super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                           _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                  lVar8 + 0xfffffffffffffff8U),
                  (this_00->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar6 + -1]);
    memcpy((void *)((long)(pVVar3->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                          _M_impl.super__Vector_impl_data._M_start[1].super_CoordSys.offset +
                   lVar8 + 0xfffffffffffffff8U),(Geometry *)&lis,200);
    lVar8 = lVar8 + 200;
  }
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&Domains);
  std::__cxx11::string::~string((string *)&word);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::~string((string *)&fileCharPtrString);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&fileCharPtr);
  return;
}

Assistant:

void
PltFileManager::readGenericPlotfileHeader(const std::string& a_pltFileHeader)
{
  Vector<char> fileCharPtr;
  ParallelDescriptor::ReadAndBcastFile(a_pltFileHeader, fileCharPtr);
  std::string fileCharPtrString(fileCharPtr.dataPtr());
  std::istringstream is(fileCharPtrString, std::istringstream::in);

  std::string line, word;

  // Title line
  std::getline(is, line);

  // Number of variables
  m_nvars = 0;
  is >> m_nvars;
  GotoNextLine(is);

  // Extract variables names
  m_vars.resize(m_nvars);
  for (int n = 0; n < m_nvars; n++) {
    is >> m_vars[n];
    GotoNextLine(is);
  }

  // Get and check space dimension
  int PLT_SPACEDIM = AMREX_SPACEDIM;
  is >> PLT_SPACEDIM;
  GotoNextLine(is);
  AMREX_ASSERT(PLT_SPACEDIM == AMREX_SPACEDIM);

  // Simulation time
  is >> m_time;
  GotoNextLine(is);

  // Number of levels
  is >> m_nlevels;
  GotoNextLine(is);
  m_nlevels += 1; // Finest is stored, need to add 1

  // Setup data holders
  m_grids.resize(m_nlevels);
  m_geoms.resize(m_nlevels);
  m_refRatio.resize(m_nlevels - 1);

  // Level 0 geometry
  Real prob_lo[AMREX_SPACEDIM];
  Real prob_hi[AMREX_SPACEDIM];
  // Low coordinates of domain bounding box
  std::getline(is, line);
  {
    std::istringstream lis(line);
    int i = 0;
    while (lis >> word) {
      prob_lo[i++] = std::stod(word);
    }
  }

  // High coordinates of domain bounding box
  std::getline(is, line);
  {
    std::istringstream lis(line);
    int i = 0;
    while (lis >> word) {
      prob_hi[i++] = std::stod(word);
    }
  }

  // Set up PltFile domain real box
  RealBox rb(prob_lo, prob_hi);

  std::getline(is, line);
  {
    std::istringstream lis(line);
    int i = 0;
    while (lis >> word) {
      m_refRatio[i++] = std::stoi(word);
    }
  }

  // Get levels Domains
  Vector<Box> Domains(m_nlevels);
  for (int lev = 0; lev < m_nlevels; ++lev) {
    is >> Domains[lev];
  }
  GotoNextLine(is);
  GotoNextLine(is); // Skip nsteps line
  for (int lev = 0; lev < m_nlevels; ++lev) {
    GotoNextLine(is); // Skip dx line
  }

  // Coordinate system
  int coord_sys = 0;
  is >> coord_sys;
  GotoNextLine(is);

  // Populate the geometry vector, assume no periodicity
  Array<int, AMREX_SPACEDIM> perio({AMREX_D_DECL(0, 0, 0)});
  m_geoms[0] = Geometry(Domains[0], rb, coord_sys, perio);
  for (int lev = 1; lev < m_nlevels; ++lev) {
    m_geoms[lev] = refine(m_geoms[lev - 1], m_refRatio[lev - 1]);
  }
}